

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::addPattern<Catch::TestSpec::TagPattern>(TestSpecParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  long *plVar5;
  pointer puVar6;
  pointer puVar7;
  ulong uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  bool bVar11;
  string token;
  value_type local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  long lStack_a0;
  element_type local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&this->m_arg);
  puVar6 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar7 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar6) {
    uVar8 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_50);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
      _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_98._vptr_Pattern != local_88) {
        _Var9._M_pi = local_88[0]._M_pi;
      }
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(_Stack_90._M_pi)->_vptr__Sp_counted_base + local_68);
      if (_Var9._M_pi < p_Var2) {
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if (local_70 != local_60) {
          p_Var10 = local_60[0];
        }
        if (p_Var10 < p_Var2) goto LAB_0013695a;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_70,0,(char *)0x0,(ulong)local_98._vptr_Pattern);
      }
      else {
LAB_0013695a:
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_70);
      }
      p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar5 + 2);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar5 == p_Var1) {
        local_a8._M_pi = p_Var1->_M_pi;
        lStack_a0 = plVar5[3];
        local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_a8;
      }
      else {
        local_a8._M_pi = p_Var1->_M_pi;
        local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar5;
      }
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
      *plVar5 = (long)p_Var1;
      plVar5[1] = 0;
      *(undefined1 *)&p_Var1->_M_pi = 0;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b8);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != &local_a8) {
        operator_delete(local_b8.
                        super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_98._vptr_Pattern != local_88) {
        operator_delete(local_98._vptr_Pattern);
      }
      uVar8 = uVar8 + 1;
      puVar6 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar8 < (ulong)((long)puVar7 - (long)puVar6 >> 3));
  }
  if (puVar7 != puVar6) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
  }
  local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"exclude:","");
  if (local_50._M_string_length <
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi) {
    bVar11 = false;
  }
  else if (local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar11 = true;
  }
  else {
    iVar4 = bcmp(local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,local_50._M_dataplus._M_p,
                 (size_t)local_b8.
                         super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    bVar11 = iVar4 == 0;
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &local_a8) {
    operator_delete(local_b8.
                    super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if (bVar11) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_a8) {
      operator_delete(local_b8.
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_98._vptr_Pattern = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Catch::TestSpec::TagPattern,std::allocator<Catch::TestSpec::TagPattern>,std::__cxx11::string&>
              (&_Stack_90,(TagPattern **)&local_98,
               (allocator<Catch::TestSpec::TagPattern> *)&local_70,&local_50);
    local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._vptr_Pattern;
    local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_90._M_pi;
    if (this->m_exclusion == true) {
      local_98._vptr_Pattern = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::TestSpec::ExcludedPattern,std::allocator<Catch::TestSpec::ExcludedPattern>,std::shared_ptr<Catch::TestSpec::Pattern>&>
                (&_Stack_90,(ExcludedPattern **)&local_98,
                 (allocator<Catch::TestSpec::ExcludedPattern> *)&local_70,&local_b8);
      _Var3._M_pi = _Stack_90._M_pi;
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_98._vptr_Pattern;
      _Var9._M_pi = local_b8.
                    super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_98._vptr_Pattern = (_func_int **)0x0;
      _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var3._M_pi;
      if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
      }
      if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
      }
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,&local_b8);
    if (local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( std::size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                TestSpec::PatternPtr pattern = std::make_shared<T>( token );
                if( m_exclusion )
                    pattern = std::make_shared<TestSpec::ExcludedPattern>( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }